

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double categ_gain<unsigned_long,double>
                 (unsigned_long cnt_left,unsigned_long cnt_right,double s_left,double s_right,
                 double base_info,double cnt)

{
  ulong in_RSI;
  ulong in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  undefined8 local_58;
  undefined8 local_40;
  
  if (in_RDI < 2) {
    local_40 = 0.0;
  }
  else {
    auVar2._8_4_ = (int)(in_RDI >> 0x20);
    auVar2._0_8_ = in_RDI;
    auVar2._12_4_ = 0x45300000;
    local_40 = (auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0);
    dVar1 = log(local_40);
    local_40 = local_40 * dVar1;
  }
  if (in_RSI < 2) {
    local_58 = 0.0;
  }
  else {
    auVar3._8_4_ = (int)(in_RSI >> 0x20);
    auVar3._0_8_ = in_RSI;
    auVar3._12_4_ = 0x45300000;
    local_58 = (auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0);
    dVar1 = log(local_58);
    local_58 = local_58 * dVar1;
  }
  return ((in_XMM2_Qa - (local_40 - in_XMM0_Qa)) - (local_58 - in_XMM1_Qa)) / in_XMM3_Qa;
}

Assistant:

double categ_gain(number cnt_left, number cnt_right,
                  ldouble_safe s_left, ldouble_safe s_right,
                  ldouble_safe base_info, ldouble_safe cnt)
{
    return (
            base_info -
            (((cnt_left  <= 1)? 0 : ((ldouble_safe)cnt_left  * std::log((ldouble_safe)cnt_left)))  - s_left) -
            (((cnt_right <= 1)? 0 : ((ldouble_safe)cnt_right * std::log((ldouble_safe)cnt_right))) - s_right)
            ) / cnt;
}